

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDependence.h
# Opt level: O2

void __thiscall
dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
          (LLVMDataDependenceAnalysis *this,Module *m,LLVMPointerAnalysis *pta,
          LLVMDataDependenceAnalysisOptions *opts)

{
  LLVMReadWriteGraphBuilder *pLVar1;
  
  this->m = m;
  this->pta = pta;
  LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions(&this->_options,opts);
  pLVar1 = (LLVMReadWriteGraphBuilder *)dg::dda::LLVMDataDependenceAnalysis::createBuilder();
  this->builder = pLVar1;
  (this->DDA)._M_t.
  super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
  .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>._M_head_impl =
       (DataDependenceAnalysis *)0x0;
  return;
}

Assistant:

LLVMDataDependenceAnalysis(const llvm::Module *m,
                               dg::LLVMPointerAnalysis *pta,
                               LLVMDataDependenceAnalysisOptions opts = {})
            : m(m), pta(pta), _options(std::move(opts)),
              builder(createBuilder()) {}